

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86_avx::forward(Padding_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  float fVar2;
  int iVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 auVar12 [24];
  undefined8 uVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  __m256 afVar21;
  int iVar22;
  ulong uVar23;
  sbyte sVar24;
  Mat *pMVar25;
  ulong uVar26;
  Mat *pMVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  undefined1 (*pauVar31) [16];
  undefined1 (*pauVar32) [32];
  int iVar33;
  int iVar34;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  undefined1 (*pauVar37) [32];
  uint uVar38;
  ulong uVar39;
  long lVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  __m256 pad_value;
  __m256 pad_value_1;
  undefined1 local_140 [8];
  undefined8 uStack_138;
  undefined8 uStack_130;
  float fStack_128;
  float fStack_124;
  Allocator *local_120;
  int local_118;
  undefined1 local_114 [16];
  ulong local_100;
  ulong local_e0;
  Mat *local_d8;
  ulong local_d0;
  int local_c4;
  __m256 local_c0;
  undefined1 local_a0 [112];
  
  afVar21 = local_c0;
  auVar5._0_4_ = (this->super_Padding).top;
  auVar5._4_4_ = (this->super_Padding).bottom;
  auVar5._8_4_ = (this->super_Padding).left;
  auVar5._12_4_ = (this->super_Padding).right;
  uVar38 = (this->super_Padding).front;
  iVar22 = (this->super_Padding).behind;
  if ((iVar22 == 0 && uVar38 == 0) && auVar5 == (undefined1  [16])0x0) {
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar22 = bottom_blob->w;
      iVar30 = bottom_blob->h;
      iVar33 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar22;
      top_blob->h = iVar30;
      top_blob->d = iVar33;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  fStack_128 = (float)bottom_blob->elempack;
  uStack_130 = bottom_blob->elemsize;
  if (fStack_128 == 0.0) {
    auVar43._0_4_ = bottom_blob->w;
    auVar43._4_4_ = bottom_blob->h;
    auVar43._8_4_ = bottom_blob->d;
    auVar43._12_4_ = bottom_blob->c;
    local_118 = bottom_blob->dims;
  }
  else {
    if (((int)uStack_130 * 8) / (int)fStack_128 == 8) {
      iVar22 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar22;
    }
    auVar43._0_4_ = bottom_blob->w;
    auVar43._4_4_ = bottom_blob->h;
    auVar43._8_4_ = bottom_blob->d;
    auVar43._12_4_ = bottom_blob->c;
    local_118 = bottom_blob->dims;
    local_d8 = bottom_blob;
    if (fStack_128 == 5.60519e-45) {
      switch(local_118) {
      case 1:
        local_118 = 1;
        if ((((auVar5 & (undefined1  [16])0x3) == (undefined1  [16])0x0) &&
            (uVar38 = auVar5._8_4_ + auVar43._0_4_ * 4 + auVar5._12_4_, (uVar38 & 7) == 4)) &&
           ((this->super_Padding).type == 0)) {
          Mat::create(top_blob,(int)uVar38 >> 2,
                      (uStack_130 >> 2) <<
                      ((auVar5 & (undefined1  [16])0x300000000) == (undefined1  [16])0x0) * '\x02',4
                      ,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_140._4_4_ = (this->super_Padding).value;
            local_140._0_4_ = local_140._4_4_;
            uStack_138 = (int *)CONCAT44(local_140._4_4_,local_140._4_4_);
            iVar22 = (this->super_Padding).left;
            iVar30 = iVar22 + 3;
            if (-1 < iVar22) {
              iVar30 = iVar22;
            }
            iVar22 = (this->super_Padding).right;
            iVar33 = iVar22 + 3;
            if (-1 < iVar22) {
              iVar33 = iVar22;
            }
            padding_constant_pack4_sse
                      ((ncnn *)local_d8,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0,
                       iVar30 >> 2,iVar33 >> 2,(__m128 *)local_140);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        local_118 = 2;
        if ((((auVar5 & (undefined1  [16])0x3) == (undefined1  [16])0x0) &&
            (uVar38 = auVar5._0_4_ + auVar43._4_4_ * 4 + auVar5._4_4_, (uVar38 & 7) == 4)) &&
           ((this->super_Padding).type == 0)) {
          auVar42 = vpshufd_avx(auVar5,0xee);
          auVar43 = vpaddd_avx(auVar42,auVar43);
          auVar42 = vpshufd_avx(auVar5,0xff);
          auVar43 = vpaddd_avx(auVar43,auVar42);
          Mat::create(top_blob,auVar43._0_4_,(int)uVar38 >> 2,
                      (uStack_130 >> 2) <<
                      ((auVar5 & (undefined1  [16])0x300000000) == (undefined1  [16])0x0) * '\x02',4
                      ,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_140._4_4_ = (this->super_Padding).value;
            local_140._0_4_ = local_140._4_4_;
            uStack_138 = (int *)CONCAT44(local_140._4_4_,local_140._4_4_);
            iVar22 = (this->super_Padding).top;
            iVar30 = (this->super_Padding).bottom;
            iVar33 = iVar22 + 3;
            if (-1 < iVar22) {
              iVar33 = iVar22;
            }
            iVar22 = iVar30 + 3;
            if (-1 < iVar30) {
              iVar22 = iVar30;
            }
            padding_constant_pack4_sse
                      ((ncnn *)local_d8,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                       iVar33 >> 2,iVar22 >> 2,(this->super_Padding).left,
                       (this->super_Padding).right,(__m128 *)local_140);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        local_c0[1] = 0.0;
        local_c0[0] = (float)auVar43._12_4_;
        local_c0._8_24_ = afVar21._8_24_;
        uVar28 = uVar38 + auVar43._12_4_ * 4 + iVar22;
        sVar24 = ((uVar28 & 3) == 0) * '\x02';
        local_118 = 3;
        if ((uVar28 & 7) == 0) {
          sVar24 = 3;
        }
        if ((((uVar38 & 3) == 0) && ((uVar28 & 7) == 4)) &&
           ((uVar28 == auVar43._12_4_ * 4 || ((this->super_Padding).type == 0)))) {
          auVar42 = vpshufd_avx(auVar5,0xee);
          auVar42 = vpaddd_avx(auVar42,auVar43);
          auVar41 = vpshufd_avx(auVar5,0xff);
          auVar42 = vpaddd_avx(auVar42,auVar41);
          auVar43 = vpshufd_avx(auVar43,0x55);
          auVar43 = vpaddd_avx(auVar5,auVar43);
          auVar5 = vpshufd_avx(auVar5,0x55);
          auVar5 = vpaddd_avx(auVar43,auVar5);
          uVar28 = (int)uVar28 >> 2;
          Mat::create(top_blob,auVar42._0_4_,auVar5._0_4_,uVar28,(uStack_130 >> 2) << sVar24,4,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar22 = (this->super_Padding).front;
            iVar30 = iVar22 + 3;
            if (-1 < iVar22) {
              iVar30 = iVar22;
            }
            if ((int)uVar28 < 1) {
              return 0;
            }
            local_c4 = -(iVar30 >> 2);
            local_d0 = (ulong)uVar28;
            local_e0 = 0;
            iVar22 = local_c4;
            do {
              uVar39 = top_blob->elemsize;
              uVar23 = (long)top_blob->h * (long)top_blob->w;
              uVar36 = (uVar39 * uVar23 + 0xf & 0xfffffffffffffff0) / uVar39;
              if (top_blob->dims == 4) {
                uVar36 = uVar23;
              }
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar2 = (this->super_Padding).value;
                auVar41._4_4_ = fVar2;
                auVar41._0_4_ = fVar2;
                auVar41._8_4_ = fVar2;
                auVar41._12_4_ = fVar2;
              }
              else {
                auVar41 = *(undefined1 (*) [16])
                           ((long)(this->super_Padding).per_channel_pad_data.data + local_e0 * 0x10)
                ;
              }
              pMVar25 = (Mat *)(top_blob->cstep * local_e0 * uVar39 + (long)top_blob->data);
              local_a0._0_16_ = auVar41;
              uVar38 = iVar22 + (int)local_e0;
              if ((int)uVar38 < 0 || (int)local_c0[0] <= (int)uVar38) {
                iVar30 = top_blob->d * (int)uVar36;
                if (0 < iVar30) {
                  do {
                    pMVar25->data = (void *)auVar41._0_8_;
                    pMVar25->refcount = (int *)auVar41._8_8_;
                    pMVar25 = (Mat *)&pMVar25->elemsize;
                    iVar30 = iVar30 + -1;
                  } while (iVar30 != 0);
                }
              }
              else {
                iVar22 = local_d8->h;
                uVar6 = local_d8->w;
                uVar7 = local_d8->h;
                local_114._4_4_ = uVar7;
                local_114._0_4_ = uVar6;
                uStack_130 = local_d8->elemsize;
                pauVar35 = (undefined1 (*) [16])
                           ((ulong)uVar38 * local_d8->cstep * uStack_130 + (long)local_d8->data);
                fStack_128 = (float)local_d8->elempack;
                local_120 = local_d8->allocator;
                uStack_138 = (int *)0x0;
                local_114._8_4_ = 1;
                local_114._12_4_ = local_d8->d;
                uVar39 = (long)iVar22 * (long)local_d8->w;
                local_118 = local_d8->dims + -1;
                local_100 = (uStack_130 * uVar39 + 0xf & 0xfffffffffffffff0) / uStack_130;
                if (local_d8->dims == 4) {
                  local_100 = uVar39;
                }
                iVar30 = (this->super_Padding).type;
                local_140 = (undefined1  [8])pauVar35;
                if (iVar30 == 0) {
                  padding_constant_pack4_sse
                            ((ncnn *)local_140,pMVar25,(Mat *)(ulong)(uint)top_blob->w,
                             (this->super_Padding).top,(this->super_Padding).bottom,
                             (this->super_Padding).left,(this->super_Padding).right,
                             (__m128 *)local_a0);
                  iVar30 = (this->super_Padding).type;
                }
                if (iVar30 == 1) {
                  iVar30 = (this->super_Padding).top;
                  iVar33 = (this->super_Padding).bottom;
                  iVar34 = (this->super_Padding).left;
                  iVar3 = (this->super_Padding).right;
                  pMVar27 = pMVar25;
                  if (0 < iVar30) {
                    iVar29 = 0;
                    do {
                      auVar5 = *pauVar35;
                      iVar22 = iVar34;
                      if (0 < iVar34) {
                        do {
                          pMVar27->data = (void *)auVar5._0_8_;
                          pMVar27->refcount = (int *)auVar5._8_8_;
                          pMVar27 = (Mat *)&pMVar27->elemsize;
                          iVar22 = iVar22 + -1;
                        } while (iVar22 != 0);
                      }
                      if (0 < (int)local_114._0_4_) {
                        iVar22 = 0;
                        pauVar31 = pauVar35;
                        do {
                          auVar5 = *pauVar31;
                          pMVar27->data = (void *)auVar5._0_8_;
                          pMVar27->refcount = (int *)auVar5._8_8_;
                          pauVar31 = pauVar31 + 1;
                          pMVar27 = (Mat *)&pMVar27->elemsize;
                          iVar22 = iVar22 + 1;
                        } while (iVar22 < (int)local_114._0_4_);
                      }
                      iVar22 = iVar3;
                      if (0 < iVar3) {
                        do {
                          pMVar27->data = (void *)auVar5._0_8_;
                          pMVar27->refcount = (int *)auVar5._8_8_;
                          pMVar27 = (Mat *)&pMVar27->elemsize;
                          iVar22 = iVar22 + -1;
                        } while (iVar22 != 0);
                      }
                      iVar29 = iVar29 + 1;
                      iVar22 = local_114._4_4_;
                    } while (iVar29 != iVar30);
                  }
                  if (0 < iVar22) {
                    iVar22 = 0;
                    do {
                      auVar5 = *pauVar35;
                      iVar30 = iVar34;
                      if (0 < iVar34) {
                        do {
                          pMVar27->data = (void *)auVar5._0_8_;
                          pMVar27->refcount = (int *)auVar5._8_8_;
                          pMVar27 = (Mat *)&pMVar27->elemsize;
                          iVar30 = iVar30 + -1;
                        } while (iVar30 != 0);
                      }
                      if (0 < (int)local_114._0_4_) {
                        iVar30 = 0;
                        do {
                          auVar5 = *pauVar35;
                          pMVar27->data = (void *)auVar5._0_8_;
                          pMVar27->refcount = (int *)auVar5._8_8_;
                          pauVar35 = pauVar35 + 1;
                          pMVar27 = (Mat *)&pMVar27->elemsize;
                          iVar30 = iVar30 + 1;
                        } while (iVar30 < (int)local_114._0_4_);
                      }
                      iVar30 = iVar3;
                      if (0 < iVar3) {
                        do {
                          pMVar27->data = (void *)auVar5._0_8_;
                          pMVar27->refcount = (int *)auVar5._8_8_;
                          pMVar27 = (Mat *)&pMVar27->elemsize;
                          iVar30 = iVar30 + -1;
                        } while (iVar30 != 0);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 < (int)local_114._4_4_);
                  }
                  if (0 < iVar33) {
                    iVar22 = 0;
                    do {
                      auVar5 = pauVar35[-(long)(int)local_114._0_4_];
                      iVar30 = iVar34;
                      if (0 < iVar34) {
                        do {
                          pMVar27->data = (void *)auVar5._0_8_;
                          pMVar27->refcount = (int *)auVar5._8_8_;
                          pMVar27 = (Mat *)&pMVar27->elemsize;
                          iVar30 = iVar30 + -1;
                        } while (iVar30 != 0);
                      }
                      if (0 < (int)local_114._0_4_) {
                        iVar30 = 0;
                        pauVar31 = pauVar35 + -(long)(int)local_114._0_4_;
                        do {
                          auVar5 = *pauVar31;
                          pMVar27->data = (void *)auVar5._0_8_;
                          pMVar27->refcount = (int *)auVar5._8_8_;
                          pauVar31 = pauVar31 + 1;
                          pMVar27 = (Mat *)&pMVar27->elemsize;
                          iVar30 = iVar30 + 1;
                        } while (iVar30 < (int)local_114._0_4_);
                      }
                      iVar30 = iVar3;
                      if (0 < iVar3) {
                        do {
                          pMVar27->data = (void *)auVar5._0_8_;
                          pMVar27->refcount = (int *)auVar5._8_8_;
                          pMVar27 = (Mat *)&pMVar27->elemsize;
                          iVar30 = iVar30 + -1;
                        } while (iVar30 != 0);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar33);
                  }
                }
                if ((this->super_Padding).type == 2) {
                  iVar22 = (this->super_Padding).top;
                  iVar30 = (this->super_Padding).bottom;
                  uVar38 = (this->super_Padding).left;
                  uVar39 = (ulong)uVar38;
                  uVar28 = (this->super_Padding).right;
                  uVar36 = (ulong)uVar28;
                  pauVar35 = (undefined1 (*) [16])
                             ((undefined1 *)local_140 + (long)(iVar22 * local_114._0_4_ * 4) * 4);
                  if (0 < iVar22) {
                    iVar33 = 0;
                    do {
                      lVar40 = uVar39 << 4;
                      if (0 < (int)uVar38) {
                        do {
                          *(undefined1 (*) [16])pMVar25 = *(undefined1 (*) [16])(*pauVar35 + lVar40)
                          ;
                          pMVar25 = (Mat *)&pMVar25->elemsize;
                          lVar40 = lVar40 + -0x10;
                        } while (lVar40 != 0);
                      }
                      pauVar31 = pauVar35;
                      if (0 < (int)local_114._0_4_) {
                        iVar34 = 0;
                        do {
                          *(undefined1 (*) [16])pMVar25 = *pauVar31;
                          pauVar31 = pauVar31 + 1;
                          pMVar25 = (Mat *)&pMVar25->elemsize;
                          iVar34 = iVar34 + 1;
                        } while (iVar34 < (int)local_114._0_4_);
                      }
                      if (0 < (int)uVar28) {
                        lVar40 = -0x20;
                        do {
                          *(undefined1 (*) [16])pMVar25 = *(undefined1 (*) [16])(*pauVar31 + lVar40)
                          ;
                          pMVar25 = (Mat *)&pMVar25->elemsize;
                          lVar1 = uVar36 * 0x10 + lVar40;
                          lVar40 = lVar40 + -0x10;
                        } while (lVar1 != -0x10);
                      }
                      pauVar35 = (undefined1 (*) [16])
                                 ((long)pauVar35 + (long)(local_114._0_4_ * 4) * -4);
                      iVar33 = iVar33 + 1;
                    } while (iVar33 != iVar22);
                  }
                  if (0 < (int)local_114._4_4_) {
                    iVar22 = 0;
                    do {
                      lVar40 = uVar39 << 4;
                      if (0 < (int)uVar38) {
                        do {
                          *(undefined1 (*) [16])pMVar25 = *(undefined1 (*) [16])(*pauVar35 + lVar40)
                          ;
                          pMVar25 = (Mat *)&pMVar25->elemsize;
                          lVar40 = lVar40 + -0x10;
                        } while (lVar40 != 0);
                      }
                      if (0 < (int)local_114._0_4_) {
                        iVar33 = 0;
                        do {
                          *(undefined1 (*) [16])pMVar25 = *pauVar35;
                          pauVar35 = pauVar35 + 1;
                          pMVar25 = (Mat *)&pMVar25->elemsize;
                          iVar33 = iVar33 + 1;
                        } while (iVar33 < (int)local_114._0_4_);
                      }
                      if (0 < (int)uVar28) {
                        lVar40 = -0x20;
                        do {
                          *(undefined1 (*) [16])pMVar25 = *(undefined1 (*) [16])(*pauVar35 + lVar40)
                          ;
                          pMVar25 = (Mat *)&pMVar25->elemsize;
                          lVar1 = uVar36 * 0x10 + lVar40;
                          lVar40 = lVar40 + -0x10;
                        } while (lVar1 != -0x10);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 < (int)local_114._4_4_);
                  }
                  if (0 < iVar30) {
                    uVar23 = (ulong)(int)local_114._0_4_;
                    pauVar35 = pauVar35 + uVar23 * -2;
                    iVar22 = 0;
                    do {
                      lVar40 = uVar39 << 4;
                      if (0 < (int)uVar38) {
                        do {
                          *(undefined1 (*) [16])pMVar25 = *(undefined1 (*) [16])(*pauVar35 + lVar40)
                          ;
                          pMVar25 = (Mat *)&pMVar25->elemsize;
                          lVar40 = lVar40 + -0x10;
                        } while (lVar40 != 0);
                        uVar23 = (ulong)(uint)local_114._0_4_;
                      }
                      pauVar31 = pauVar35;
                      if (0 < (int)uVar23) {
                        iVar33 = 0;
                        do {
                          *(undefined1 (*) [16])pMVar25 = *pauVar31;
                          pauVar31 = pauVar31 + 1;
                          pMVar25 = (Mat *)&pMVar25->elemsize;
                          iVar33 = iVar33 + 1;
                          uVar23 = (ulong)(uint)local_114._0_4_;
                        } while (iVar33 < (int)local_114._0_4_);
                      }
                      if (0 < (int)uVar28) {
                        lVar40 = -0x20;
                        do {
                          *(undefined1 (*) [16])pMVar25 = *(undefined1 (*) [16])(*pauVar31 + lVar40)
                          ;
                          pMVar25 = (Mat *)&pMVar25->elemsize;
                          lVar1 = uVar36 * 0x10 + lVar40;
                          lVar40 = lVar40 + -0x10;
                        } while (lVar1 != -0x10);
                        uVar23 = (ulong)(uint)local_114._0_4_;
                      }
                      pauVar35 = (undefined1 (*) [16])
                                 ((long)pauVar35 + (long)((int)uVar23 * 4) * -4);
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar30);
                  }
                }
                iVar22 = local_c4;
                if (uStack_138 != (int *)0x0) {
                  LOCK();
                  *uStack_138 = *uStack_138 + -1;
                  UNLOCK();
                  if (*uStack_138 == 0) {
                    if (local_120 == (Allocator *)0x0) {
                      if (local_140 != (undefined1  [8])0x0) {
                        free((void *)local_140);
                        iVar22 = local_c4;
                      }
                    }
                    else {
                      (*local_120->_vptr_Allocator[3])();
                      iVar22 = local_c4;
                    }
                  }
                }
              }
              local_e0 = local_e0 + 1;
            } while (local_e0 != local_d0);
            return 0;
          }
          return -100;
        }
        break;
      case 4:
        local_118 = 4;
        if ((this->super_Padding).type == 0) {
          uVar38 = uVar38 + iVar22 + auVar43._8_4_;
          auVar42 = vpshufd_avx(auVar43,0x55);
          auVar42 = vpaddd_avx(auVar5,auVar42);
          auVar41 = vpshufd_avx(auVar5,0x55);
          auVar42 = vpaddd_avx(auVar42,auVar41);
          auVar41 = vpshufd_avx(auVar5,0xee);
          auVar41 = vpaddd_avx(auVar41,auVar43);
          auVar5 = vpshufd_avx(auVar5,0xff);
          auVar5 = vpaddd_avx(auVar41,auVar5);
          Mat::create(top_blob,auVar5._0_4_,auVar42._0_4_,uVar38,auVar43._12_4_,uStack_130,4,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)auVar43._12_4_ < 1) {
              return 0;
            }
            local_d0 = (ulong)(uint)auVar43._12_4_;
            uVar39 = 0;
            local_e0 = (ulong)uVar38;
            do {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar2 = (this->super_Padding).value;
                auVar42._4_4_ = fVar2;
                auVar42._0_4_ = fVar2;
                auVar42._8_4_ = fVar2;
                auVar42._12_4_ = fVar2;
              }
              else {
                auVar42 = *(undefined1 (*) [16])
                           ((long)(this->super_Padding).per_channel_pad_data.data + uVar39 * 0x10);
              }
              auVar45 = ZEXT1664(auVar42);
              local_a0._0_16_ = auVar42;
              if (0 < (int)local_e0) {
                uVar36 = 0;
                local_c0[0] = (float)auVar42._0_4_;
                local_c0[1] = (float)auVar42._4_4_;
                local_c0[2] = (float)auVar42._8_4_;
                local_c0[3] = (float)auVar42._12_4_;
                do {
                  uVar23 = (long)top_blob->h * (long)top_blob->w;
                  pMVar25 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar36 * uVar23 +
                                   top_blob->cstep * uVar39 * top_blob->elemsize);
                  uVar28 = (int)uVar36 - (this->super_Padding).front;
                  if ((int)uVar28 < 0 || (int)auVar43._8_4_ <= (int)uVar28) {
                    if (0 < (int)uVar23) {
                      do {
                        pMVar25->data = (void *)SUB168(auVar45._0_16_,0);
                        pMVar25->refcount = (int *)SUB168(auVar45._0_16_,8);
                        pMVar25 = (Mat *)&pMVar25->elemsize;
                        uVar28 = (int)uVar23 - 1;
                        uVar23 = (ulong)uVar28;
                      } while (uVar28 != 0);
                    }
                  }
                  else {
                    uVar10 = local_d8->w;
                    uVar11 = local_d8->h;
                    local_114._4_4_ = uVar11;
                    local_114._0_4_ = uVar10;
                    uStack_130 = local_d8->elemsize;
                    fStack_128 = (float)local_d8->elempack;
                    local_120 = local_d8->allocator;
                    local_100 = (long)local_d8->h * (long)local_d8->w;
                    local_140 = (undefined1  [8])
                                ((long)local_d8->data +
                                uVar28 * uStack_130 * local_100 +
                                local_d8->cstep * uVar39 * uStack_130);
                    uStack_138 = (int *)0x0;
                    local_118 = 2;
                    local_114._8_8_ = 0x100000001;
                    padding_constant_pack4_sse
                              ((ncnn *)local_140,pMVar25,(Mat *)(long)top_blob->w,
                               (this->super_Padding).top,(this->super_Padding).bottom,
                               (this->super_Padding).left,(this->super_Padding).right,
                               (__m128 *)local_a0);
                    auVar45 = ZEXT1664(local_c0._0_16_);
                  }
                  uVar36 = uVar36 + 1;
                } while (uVar36 != uVar38);
              }
              uVar39 = uVar39 + 1;
            } while (uVar39 != local_d0);
            return 0;
          }
          return -100;
        }
      }
    }
    else if (fStack_128 == 1.12104e-44) {
      switch(local_118) {
      case 1:
        auVar42 = vphaddd_avx(auVar5,auVar5);
        uVar38 = auVar42._4_4_;
        local_118 = 1;
        if (((auVar5._8_4_ | uVar38) & 7) == 0 && (this->super_Padding).type == 0) {
          iVar22 = uVar38 + auVar43._0_4_ * 8;
          iVar30 = uVar38 + auVar43._0_4_ * 8 + 7;
          if (-1 < iVar22) {
            iVar30 = iVar22;
          }
          Mat::create(top_blob,iVar30 >> 3,uStack_130 & 0xfffffffffffffff8,8,opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              fStack_128 = (this->super_Padding).value;
              local_140._4_4_ = fStack_128;
              local_140._0_4_ = fStack_128;
              uStack_138 = (int *)CONCAT44(fStack_128,fStack_128);
              uStack_130 = CONCAT44(fStack_128,fStack_128);
              iVar22 = (this->super_Padding).left;
              iVar30 = iVar22 + 7;
              if (-1 < iVar22) {
                iVar30 = iVar22;
              }
              iVar22 = (this->super_Padding).right;
              iVar33 = iVar22 + 7;
              if (-1 < iVar22) {
                iVar33 = iVar22;
              }
              fStack_124 = fStack_128;
              padding_constant_pack8_avx
                        ((ncnn *)local_d8,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0,
                         iVar30 >> 3,iVar33 >> 3,(__m256 *)local_140);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 2:
        uVar38 = auVar5._4_4_ + auVar5._0_4_ + auVar43._4_4_ * 8;
        local_118 = 2;
        if (((auVar5._0_4_ | uVar38) & 7) == 0 && (this->super_Padding).type == 0) {
          auVar42 = vpshufd_avx(auVar5,0xee);
          auVar43 = vpaddd_avx(auVar42,auVar43);
          auVar5 = vpshufd_avx(auVar5,0xff);
          auVar5 = vpaddd_avx(auVar43,auVar5);
          uVar28 = uVar38 + 7;
          if (-1 < (int)uVar38) {
            uVar28 = uVar38;
          }
          Mat::create(top_blob,auVar5._0_4_,(int)uVar28 >> 3,uStack_130 & 0xfffffffffffffff8,8,
                      opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              fStack_128 = (this->super_Padding).value;
              local_140._4_4_ = fStack_128;
              local_140._0_4_ = fStack_128;
              uStack_138 = (int *)CONCAT44(fStack_128,fStack_128);
              uStack_130 = CONCAT44(fStack_128,fStack_128);
              iVar22 = (this->super_Padding).top;
              iVar30 = (this->super_Padding).bottom;
              iVar33 = iVar22 + 7;
              if (-1 < iVar22) {
                iVar33 = iVar22;
              }
              iVar22 = iVar30 + 7;
              if (-1 < iVar30) {
                iVar22 = iVar30;
              }
              fStack_124 = fStack_128;
              padding_constant_pack8_avx
                        ((ncnn *)local_d8,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                         iVar33 >> 3,iVar22 >> 3,(this->super_Padding).left,
                         (this->super_Padding).right,(__m256 *)local_140);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 3:
        uVar28 = uVar38 + auVar43._12_4_ * 8 + iVar22;
        sVar24 = ((uVar28 & 3) == 0) * '\x02';
        local_118 = 3;
        if ((uVar28 & 7) == 0) {
          sVar24 = 3;
        }
        if ((((uVar38 | uVar28) & 7) == 0) &&
           ((uVar28 == auVar43._12_4_ * 8 || ((this->super_Padding).type == 0)))) {
          auVar42 = vpshufd_avx(auVar5,0xee);
          auVar42 = vpaddd_avx(auVar42,auVar43);
          auVar41 = vpshufd_avx(auVar5,0xff);
          auVar42 = vpaddd_avx(auVar42,auVar41);
          auVar41 = vpshufd_avx(auVar43,0x55);
          auVar41 = vpaddd_avx(auVar5,auVar41);
          auVar5 = vpshufd_avx(auVar5,0x55);
          auVar5 = vpaddd_avx(auVar41,auVar5);
          uVar38 = uVar28 + 7;
          if (-1 < (int)uVar28) {
            uVar38 = uVar28;
          }
          Mat::create(top_blob,auVar42._0_4_,auVar5._0_4_,(int)uVar38 >> 3,
                      (uStack_130 >> 3) << sVar24,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          iVar22 = (this->super_Padding).front;
          iVar30 = iVar22 + 7;
          if (-1 < iVar22) {
            iVar30 = iVar22;
          }
          if ((int)uVar28 < 8) {
            return 0;
          }
          iVar22 = -(iVar30 >> 3);
          local_e0 = (ulong)(uint)((int)uVar38 >> 3);
          uVar39 = 0;
          local_d0 = CONCAT44(local_d0._4_4_,iVar22);
          do {
            uVar36 = top_blob->elemsize;
            uVar26 = (long)top_blob->h * (long)top_blob->w;
            uVar23 = (uVar36 * uVar26 + 0xf & 0xfffffffffffffff0) / uVar36;
            if (top_blob->dims == 4) {
              uVar23 = uVar26;
            }
            if ((this->super_Padding).per_channel_pad_data_size == 0) {
              fVar2 = (this->super_Padding).value;
              local_a0._4_4_ = fVar2;
              local_a0._0_4_ = fVar2;
              local_a0._8_4_ = fVar2;
              local_a0._12_4_ = fVar2;
              local_a0._16_4_ = fVar2;
              local_a0._20_4_ = fVar2;
              local_a0._24_4_ = fVar2;
              local_a0._28_4_ = fVar2;
            }
            else {
              local_a0._0_32_ =
                   *(undefined1 (*) [32])
                    ((long)(this->super_Padding).per_channel_pad_data.data + uVar39 * 0x20);
            }
            pMVar25 = (Mat *)(top_blob->cstep * uVar39 * uVar36 + (long)top_blob->data);
            uVar38 = iVar22 + (int)uVar39;
            if ((int)uVar38 < 0 || (int)auVar43._12_4_ <= (int)uVar38) {
              iVar30 = top_blob->d * (int)uVar23;
              if (0 < iVar30) {
                do {
                  *(undefined1 (*) [32])pMVar25 = local_a0._0_32_;
                  pMVar25 = (Mat *)&pMVar25->allocator;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
            }
            else {
              iVar22 = local_d8->h;
              uVar19 = local_d8->w;
              uVar20 = local_d8->h;
              local_114._4_4_ = uVar20;
              local_114._0_4_ = uVar19;
              uStack_130 = local_d8->elemsize;
              pauVar37 = (undefined1 (*) [32])
                         ((ulong)uVar38 * local_d8->cstep * uStack_130 + (long)local_d8->data);
              fStack_128 = (float)local_d8->elempack;
              local_120 = local_d8->allocator;
              uStack_138 = (int *)0x0;
              local_114._8_4_ = 1;
              local_114._12_4_ = local_d8->d;
              uVar36 = (long)iVar22 * (long)local_d8->w;
              local_118 = local_d8->dims + -1;
              local_100 = (uStack_130 * uVar36 + 0xf & 0xfffffffffffffff0) / uStack_130;
              if (local_d8->dims == 4) {
                local_100 = uVar36;
              }
              iVar30 = (this->super_Padding).type;
              local_c0[0] = (float)(int)uVar39;
              local_c0[1] = (float)(int)(uVar39 >> 0x20);
              local_140 = (undefined1  [8])pauVar37;
              if (iVar30 == 0) {
                padding_constant_pack8_avx
                          ((ncnn *)local_140,pMVar25,(Mat *)(ulong)(uint)top_blob->w,
                           (this->super_Padding).top,(this->super_Padding).bottom,
                           (this->super_Padding).left,(this->super_Padding).right,(__m256 *)local_a0
                          );
                iVar30 = (this->super_Padding).type;
              }
              if (iVar30 == 1) {
                iVar30 = (this->super_Padding).top;
                iVar33 = (this->super_Padding).bottom;
                iVar34 = (this->super_Padding).left;
                iVar3 = (this->super_Padding).right;
                pMVar27 = pMVar25;
                if (0 < iVar30) {
                  iVar29 = 0;
                  do {
                    auVar44 = *pauVar37;
                    iVar22 = iVar34;
                    if (0 < iVar34) {
                      do {
                        pMVar27->data = (void *)auVar44._0_8_;
                        pMVar27->refcount = (int *)auVar44._8_8_;
                        pMVar27->elemsize = auVar44._16_8_;
                        pMVar27->elempack = auVar44._24_4_;
                        *(int *)&pMVar27->field_0x1c = auVar44._28_4_;
                        pMVar27 = (Mat *)&pMVar27->allocator;
                        iVar22 = iVar22 + -1;
                      } while (iVar22 != 0);
                    }
                    if (0 < (int)local_114._0_4_) {
                      iVar22 = 0;
                      pauVar32 = pauVar37;
                      do {
                        auVar44 = *pauVar32;
                        pMVar27->data = (void *)auVar44._0_8_;
                        pMVar27->refcount = (int *)auVar44._8_8_;
                        pMVar27->elemsize = auVar44._16_8_;
                        pMVar27->elempack = auVar44._24_4_;
                        *(int *)&pMVar27->field_0x1c = auVar44._28_4_;
                        pauVar32 = pauVar32 + 1;
                        pMVar27 = (Mat *)&pMVar27->allocator;
                        iVar22 = iVar22 + 1;
                      } while (iVar22 < (int)local_114._0_4_);
                    }
                    iVar22 = iVar3;
                    if (0 < iVar3) {
                      do {
                        pMVar27->data = (void *)auVar44._0_8_;
                        pMVar27->refcount = (int *)auVar44._8_8_;
                        pMVar27->elemsize = auVar44._16_8_;
                        pMVar27->elempack = auVar44._24_4_;
                        *(int *)&pMVar27->field_0x1c = auVar44._28_4_;
                        pMVar27 = (Mat *)&pMVar27->allocator;
                        iVar22 = iVar22 + -1;
                      } while (iVar22 != 0);
                    }
                    iVar29 = iVar29 + 1;
                    iVar22 = local_114._4_4_;
                  } while (iVar29 != iVar30);
                }
                if (0 < iVar22) {
                  iVar22 = 0;
                  do {
                    auVar44 = *pauVar37;
                    iVar30 = iVar34;
                    if (0 < iVar34) {
                      do {
                        pMVar27->data = (void *)auVar44._0_8_;
                        pMVar27->refcount = (int *)auVar44._8_8_;
                        pMVar27->elemsize = auVar44._16_8_;
                        pMVar27->elempack = auVar44._24_4_;
                        *(int *)&pMVar27->field_0x1c = auVar44._28_4_;
                        pMVar27 = (Mat *)&pMVar27->allocator;
                        iVar30 = iVar30 + -1;
                      } while (iVar30 != 0);
                    }
                    if (0 < (int)local_114._0_4_) {
                      iVar30 = 0;
                      do {
                        auVar44 = *pauVar37;
                        pMVar27->data = (void *)auVar44._0_8_;
                        pMVar27->refcount = (int *)auVar44._8_8_;
                        pMVar27->elemsize = auVar44._16_8_;
                        pMVar27->elempack = auVar44._24_4_;
                        *(int *)&pMVar27->field_0x1c = auVar44._28_4_;
                        pauVar37 = pauVar37 + 1;
                        pMVar27 = (Mat *)&pMVar27->allocator;
                        iVar30 = iVar30 + 1;
                      } while (iVar30 < (int)local_114._0_4_);
                    }
                    iVar30 = iVar3;
                    if (0 < iVar3) {
                      do {
                        pMVar27->data = (void *)auVar44._0_8_;
                        pMVar27->refcount = (int *)auVar44._8_8_;
                        pMVar27->elemsize = auVar44._16_8_;
                        pMVar27->elempack = auVar44._24_4_;
                        *(int *)&pMVar27->field_0x1c = auVar44._28_4_;
                        pMVar27 = (Mat *)&pMVar27->allocator;
                        iVar30 = iVar30 + -1;
                      } while (iVar30 != 0);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 < (int)local_114._4_4_);
                }
                if (0 < iVar33) {
                  iVar22 = 0;
                  do {
                    auVar44 = pauVar37[-(long)(int)local_114._0_4_];
                    iVar30 = iVar34;
                    if (0 < iVar34) {
                      do {
                        pMVar27->data = (void *)auVar44._0_8_;
                        pMVar27->refcount = (int *)auVar44._8_8_;
                        pMVar27->elemsize = auVar44._16_8_;
                        pMVar27->elempack = auVar44._24_4_;
                        *(int *)&pMVar27->field_0x1c = auVar44._28_4_;
                        pMVar27 = (Mat *)&pMVar27->allocator;
                        iVar30 = iVar30 + -1;
                      } while (iVar30 != 0);
                    }
                    if (0 < (int)local_114._0_4_) {
                      iVar30 = 0;
                      pauVar32 = pauVar37 + -(long)(int)local_114._0_4_;
                      do {
                        auVar44 = *pauVar32;
                        pMVar27->data = (void *)auVar44._0_8_;
                        pMVar27->refcount = (int *)auVar44._8_8_;
                        pMVar27->elemsize = auVar44._16_8_;
                        pMVar27->elempack = auVar44._24_4_;
                        *(int *)&pMVar27->field_0x1c = auVar44._28_4_;
                        pauVar32 = pauVar32 + 1;
                        pMVar27 = (Mat *)&pMVar27->allocator;
                        iVar30 = iVar30 + 1;
                      } while (iVar30 < (int)local_114._0_4_);
                    }
                    iVar30 = iVar3;
                    if (0 < iVar3) {
                      do {
                        pMVar27->data = (void *)auVar44._0_8_;
                        pMVar27->refcount = (int *)auVar44._8_8_;
                        pMVar27->elemsize = auVar44._16_8_;
                        pMVar27->elempack = auVar44._24_4_;
                        *(int *)&pMVar27->field_0x1c = auVar44._28_4_;
                        pMVar27 = (Mat *)&pMVar27->allocator;
                        iVar30 = iVar30 + -1;
                      } while (iVar30 != 0);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar33);
                }
              }
              if ((this->super_Padding).type == 2) {
                iVar22 = (this->super_Padding).top;
                iVar30 = (this->super_Padding).bottom;
                uVar38 = (this->super_Padding).left;
                uVar39 = (ulong)uVar38;
                uVar28 = (this->super_Padding).right;
                uVar36 = (ulong)uVar28;
                pauVar37 = (undefined1 (*) [32])
                           ((undefined1 *)local_140 + (long)(iVar22 * local_114._0_4_ * 8) * 4);
                if (0 < iVar22) {
                  iVar33 = 0;
                  do {
                    lVar40 = uVar39 << 5;
                    if (0 < (int)uVar38) {
                      do {
                        *(undefined1 (*) [32])pMVar25 = *(undefined1 (*) [32])(*pauVar37 + lVar40);
                        pMVar25 = (Mat *)&pMVar25->allocator;
                        lVar40 = lVar40 + -0x20;
                      } while (lVar40 != 0);
                    }
                    pauVar32 = pauVar37;
                    if (0 < (int)local_114._0_4_) {
                      iVar34 = 0;
                      do {
                        *(undefined1 (*) [32])pMVar25 = *pauVar32;
                        pauVar32 = pauVar32 + 1;
                        pMVar25 = (Mat *)&pMVar25->allocator;
                        iVar34 = iVar34 + 1;
                      } while (iVar34 < (int)local_114._0_4_);
                    }
                    if (0 < (int)uVar28) {
                      lVar40 = -0x40;
                      do {
                        *(undefined1 (*) [32])pMVar25 = *(undefined1 (*) [32])(*pauVar32 + lVar40);
                        pMVar25 = (Mat *)&pMVar25->allocator;
                        lVar1 = uVar36 * 0x20 + lVar40;
                        lVar40 = lVar40 + -0x20;
                      } while (lVar1 != -0x20);
                    }
                    pauVar37 = (undefined1 (*) [32])
                               ((long)pauVar37 + (long)(local_114._0_4_ * 8) * -4);
                    iVar33 = iVar33 + 1;
                  } while (iVar33 != iVar22);
                }
                if (0 < (int)local_114._4_4_) {
                  iVar22 = 0;
                  do {
                    lVar40 = uVar39 << 5;
                    if (0 < (int)uVar38) {
                      do {
                        *(undefined1 (*) [32])pMVar25 = *(undefined1 (*) [32])(*pauVar37 + lVar40);
                        pMVar25 = (Mat *)&pMVar25->allocator;
                        lVar40 = lVar40 + -0x20;
                      } while (lVar40 != 0);
                    }
                    if (0 < (int)local_114._0_4_) {
                      iVar33 = 0;
                      do {
                        *(undefined1 (*) [32])pMVar25 = *pauVar37;
                        pauVar37 = pauVar37 + 1;
                        pMVar25 = (Mat *)&pMVar25->allocator;
                        iVar33 = iVar33 + 1;
                      } while (iVar33 < (int)local_114._0_4_);
                    }
                    if (0 < (int)uVar28) {
                      lVar40 = -0x40;
                      do {
                        *(undefined1 (*) [32])pMVar25 = *(undefined1 (*) [32])(*pauVar37 + lVar40);
                        pMVar25 = (Mat *)&pMVar25->allocator;
                        lVar1 = uVar36 * 0x20 + lVar40;
                        lVar40 = lVar40 + -0x20;
                      } while (lVar1 != -0x20);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 < (int)local_114._4_4_);
                }
                if (0 < iVar30) {
                  uVar23 = (ulong)(int)local_114._0_4_;
                  pauVar37 = pauVar37 + uVar23 * -2;
                  iVar22 = 0;
                  do {
                    lVar40 = uVar39 << 5;
                    if (0 < (int)uVar38) {
                      do {
                        *(undefined1 (*) [32])pMVar25 = *(undefined1 (*) [32])(*pauVar37 + lVar40);
                        pMVar25 = (Mat *)&pMVar25->allocator;
                        lVar40 = lVar40 + -0x20;
                      } while (lVar40 != 0);
                      uVar23 = (ulong)(uint)local_114._0_4_;
                    }
                    pauVar32 = pauVar37;
                    if (0 < (int)uVar23) {
                      iVar33 = 0;
                      do {
                        *(undefined1 (*) [32])pMVar25 = *pauVar32;
                        pauVar32 = pauVar32 + 1;
                        pMVar25 = (Mat *)&pMVar25->allocator;
                        iVar33 = iVar33 + 1;
                        uVar23 = (ulong)(uint)local_114._0_4_;
                      } while (iVar33 < (int)local_114._0_4_);
                    }
                    if (0 < (int)uVar28) {
                      lVar40 = -0x40;
                      do {
                        *(undefined1 (*) [32])pMVar25 = *(undefined1 (*) [32])(*pauVar32 + lVar40);
                        pMVar25 = (Mat *)&pMVar25->allocator;
                        lVar1 = uVar36 * 0x20 + lVar40;
                        lVar40 = lVar40 + -0x20;
                      } while (lVar1 != -0x20);
                      uVar23 = (ulong)(uint)local_114._0_4_;
                    }
                    pauVar37 = (undefined1 (*) [32])((long)pauVar37 + (long)((int)uVar23 * 8) * -4);
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar30);
                }
              }
              uVar39 = local_c0._0_8_;
              iVar22 = (int)local_d0;
              if (uStack_138 != (int *)0x0) {
                LOCK();
                *uStack_138 = *uStack_138 + -1;
                UNLOCK();
                if (*uStack_138 == 0) {
                  if (local_120 == (Allocator *)0x0) {
                    if (local_140 != (undefined1  [8])0x0) {
                      free((void *)local_140);
                      uVar39 = local_c0._0_8_;
                      iVar22 = (int)local_d0;
                    }
                  }
                  else {
                    (*local_120->_vptr_Allocator[3])();
                    uVar39 = local_c0._0_8_;
                    iVar22 = (int)local_d0;
                  }
                }
              }
            }
            uVar39 = uVar39 + 1;
          } while (uVar39 != local_e0);
          return 0;
        }
        break;
      case 4:
        local_118 = 4;
        if ((this->super_Padding).type == 0) {
          uVar38 = uVar38 + iVar22 + auVar43._8_4_;
          auVar42 = vpshufd_avx(auVar43,0x55);
          auVar42 = vpaddd_avx(auVar5,auVar42);
          auVar41 = vpshufd_avx(auVar5,0x55);
          auVar42 = vpaddd_avx(auVar42,auVar41);
          auVar41 = vpshufd_avx(auVar5,0xee);
          auVar41 = vpaddd_avx(auVar41,auVar43);
          auVar5 = vpshufd_avx(auVar5,0xff);
          auVar5 = vpaddd_avx(auVar41,auVar5);
          Mat::create(top_blob,auVar5._0_4_,auVar42._0_4_,uVar38,auVar43._12_4_,uStack_130,8,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)auVar43._12_4_ < 1) {
              return 0;
            }
            local_d0 = (ulong)(uint)auVar43._12_4_;
            uVar39 = 0;
            local_e0 = (ulong)uVar38;
            do {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar2 = (this->super_Padding).value;
                local_c0[1] = fVar2;
                local_c0[0] = fVar2;
                local_c0[2] = fVar2;
                local_c0[3] = fVar2;
                local_c0[4] = fVar2;
                local_c0[5] = fVar2;
                local_c0[6] = fVar2;
                local_c0[7] = fVar2;
              }
              else {
                local_c0 = *(__m256 *)
                            ((long)(this->super_Padding).per_channel_pad_data.data + uVar39 * 0x20);
              }
              auVar45 = ZEXT3264((undefined1  [32])local_c0);
              if (0 < (int)local_e0) {
                uVar36 = 0;
                local_a0._0_32_ = (undefined1  [32])local_c0;
                do {
                  uVar23 = (long)top_blob->h * (long)top_blob->w;
                  pMVar25 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar36 * uVar23 +
                                   top_blob->cstep * uVar39 * top_blob->elemsize);
                  uVar28 = (int)uVar36 - (this->super_Padding).front;
                  if ((int)uVar28 < 0 || (int)auVar43._8_4_ <= (int)uVar28) {
                    if (0 < (int)uVar23) {
                      do {
                        auVar44 = auVar45._0_32_;
                        pMVar25->data = (void *)auVar44._0_8_;
                        pMVar25->refcount = (int *)auVar44._8_8_;
                        pMVar25->elemsize = auVar44._16_8_;
                        pMVar25->elempack = auVar44._24_4_;
                        *(int *)&pMVar25->field_0x1c = auVar44._28_4_;
                        pMVar25 = (Mat *)&pMVar25->allocator;
                        uVar28 = (int)uVar23 - 1;
                        uVar23 = (ulong)uVar28;
                      } while (uVar28 != 0);
                    }
                  }
                  else {
                    uVar8 = local_d8->w;
                    uVar9 = local_d8->h;
                    local_114._4_4_ = uVar9;
                    local_114._0_4_ = uVar8;
                    uStack_130 = local_d8->elemsize;
                    fStack_128 = (float)local_d8->elempack;
                    local_120 = local_d8->allocator;
                    local_100 = (long)local_d8->h * (long)local_d8->w;
                    local_140 = (undefined1  [8])
                                ((long)local_d8->data +
                                uVar28 * uStack_130 * local_100 +
                                local_d8->cstep * uVar39 * uStack_130);
                    uStack_138 = (int *)0x0;
                    local_118 = 2;
                    local_114._8_8_ = 0x100000001;
                    padding_constant_pack8_avx
                              ((ncnn *)local_140,pMVar25,(Mat *)(long)top_blob->w,
                               (this->super_Padding).top,(this->super_Padding).bottom,
                               (this->super_Padding).left,(this->super_Padding).right,
                               (__m256 *)local_a0);
                    auVar45 = ZEXT3264((undefined1  [32])local_c0);
                  }
                  uVar36 = uVar36 + 1;
                } while (uVar36 != uVar38);
              }
              uVar39 = uVar39 + 1;
            } while (uVar39 != local_d0);
            return 0;
          }
          return -100;
        }
      }
    }
  }
  piVar4 = bottom_blob->refcount;
  local_140 = (undefined1  [8])bottom_blob->data;
  uStack_138 = bottom_blob->refcount;
  local_120 = bottom_blob->allocator;
  local_100 = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  local_114 = auVar43;
  if (fStack_128 != 1.4013e-45) {
    auVar12[0] = opt->lightmode;
    auVar12[1] = opt->use_shader_pack8;
    auVar12[2] = opt->use_subgroup_ops;
    auVar12[3] = opt->use_reserved_0;
    auVar12._4_4_ = opt->num_threads;
    auVar12._8_8_ = opt->blob_allocator;
    auVar12._16_8_ = opt->workspace_allocator;
    uVar13 = opt->workspace_allocator;
    uVar14 = opt->openmp_blocktime;
    uVar15 = opt->use_winograd_convolution;
    uVar16 = opt->use_sgemm_convolution;
    uVar17 = opt->use_int8_inference;
    uVar18 = opt->use_vulkan_compute;
    local_a0[0x1f] = uVar18;
    local_a0[0x1e] = uVar17;
    local_a0[0x1d] = uVar16;
    local_a0[0x1c] = uVar15;
    local_a0._24_4_ = uVar14;
    local_a0._16_8_ = uVar13;
    local_a0[0x20] = opt->use_bf16_storage;
    local_a0[0x21] = opt->use_fp16_packed;
    local_a0[0x22] = opt->use_fp16_storage;
    local_a0[0x23] = opt->use_fp16_arithmetic;
    local_a0[0x24] = opt->use_int8_packed;
    local_a0[0x25] = opt->use_int8_storage;
    local_a0[0x26] = opt->use_int8_arithmetic;
    local_a0[0x27] = opt->use_packing_layout;
    local_a0._40_4_ = opt->vulkan_device_index;
    local_a0[0x2c] = opt->use_reserved_1;
    local_a0[0x2d] = opt->use_image_storage;
    local_a0[0x2e] = opt->use_tensor_storage;
    local_a0[0x2f] = opt->use_reserved_2;
    local_a0._48_4_ = opt->flush_denormals;
    local_a0[0x34] = opt->use_local_pool_allocator;
    local_a0[0x35] = opt->use_shader_local_memory;
    local_a0[0x36] = opt->use_cooperative_matrix;
    local_a0[0x37] = opt->use_winograd23_convolution;
    local_a0[0x38] = opt->use_winograd43_convolution;
    local_a0[0x39] = opt->use_winograd63_convolution;
    local_a0[0x3a] = opt->use_a53_a55_optimized_kernel;
    local_a0[0x3b] = opt->use_fp16_uniform;
    local_a0[0x3c] = opt->use_int8_uniform;
    local_a0[0x3d] = opt->use_reserved_9;
    local_a0[0x3e] = opt->use_reserved_10;
    local_a0[0x3f] = opt->use_reserved_11;
    local_a0._0_8_ = auVar12._0_8_;
    local_a0._8_8_ = opt->workspace_allocator;
    convert_packing(bottom_blob,(Mat *)local_140,1,(Option *)local_a0);
    if ((local_140 == (undefined1  [8])0x0) || ((long)(int)local_114._12_4_ * local_100 == 0)) {
      iVar22 = -100;
      goto LAB_0040c650;
    }
  }
  iVar22 = Padding::forward(&this->super_Padding,(Mat *)local_140,top_blob,opt);
LAB_0040c650:
  if (uStack_138 != (int *)0x0) {
    LOCK();
    *uStack_138 = *uStack_138 + -1;
    UNLOCK();
    if (*uStack_138 == 0) {
      if (local_120 == (Allocator *)0x0) {
        if (local_140 != (undefined1  [8])0x0) {
          free((void *)local_140);
        }
      }
      else {
        (*local_120->_vptr_Allocator[3])();
      }
    }
  }
  return iVar22;
}

Assistant:

int Padding_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}